

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_ary.c
# Opt level: O2

int32_t adt_ary_indexOf(adt_ary_t *self,void *pElem)

{
  ulong uVar1;
  ulong uVar2;
  
  if (self != (adt_ary_t *)0x0) {
    uVar1 = 0;
    uVar2 = (ulong)(uint)self->s32CurLen;
    if (self->s32CurLen < 1) {
      uVar2 = uVar1;
    }
    for (; uVar2 != uVar1; uVar1 = uVar1 + 1) {
      if (self->pFirst[uVar1] == pElem) {
        return (int32_t)uVar1;
      }
    }
  }
  return -1;
}

Assistant:

int32_t adt_ary_indexOf(adt_ary_t *self, void *pElem)
{
   if (self != 0)
   {
      int32_t s32Index;
      for(s32Index = 0; s32Index < self->s32CurLen; s32Index++ )
      {
         if (self->pFirst[s32Index] == pElem) {
            return s32Index;
         }
      }
   }
   return -1;
}